

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O3

void plutovg_canvas_destroy(plutovg_canvas_t *canvas)

{
  plutovg_state_t *ppVar1;
  
  if ((canvas != (plutovg_canvas_t *)0x0) &&
     (canvas->ref_count = canvas->ref_count + -1, canvas->ref_count == 0)) {
    while (ppVar1 = canvas->state, ppVar1 != (plutovg_state_t *)0x0) {
      canvas->state = ppVar1->next;
      plutovg_state_destroy(ppVar1);
    }
    while (ppVar1 = canvas->freed_state, ppVar1 != (plutovg_state_t *)0x0) {
      canvas->freed_state = ppVar1->next;
      plutovg_state_destroy(ppVar1);
    }
    plutovg_span_buffer_destroy(&canvas->fill_spans);
    plutovg_span_buffer_destroy(&canvas->clip_spans);
    plutovg_surface_destroy(canvas->surface);
    plutovg_path_destroy(canvas->path);
    free(canvas);
    return;
  }
  return;
}

Assistant:

void plutovg_canvas_destroy(plutovg_canvas_t* canvas)
{
    if(canvas == NULL)
        return;
    if(--canvas->ref_count == 0) {
        while(canvas->state) {
            plutovg_state_t* state = canvas->state;
            canvas->state = state->next;
            plutovg_state_destroy(state);
        }

        while(canvas->freed_state) {
            plutovg_state_t* state = canvas->freed_state;
            canvas->freed_state = state->next;
            plutovg_state_destroy(state);
        }

        plutovg_span_buffer_destroy(&canvas->fill_spans);
        plutovg_span_buffer_destroy(&canvas->clip_spans);
        plutovg_surface_destroy(canvas->surface);
        plutovg_path_destroy(canvas->path);
        free(canvas);
    }
}